

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

size_t ra_portable_serialize(roaring_array_t *ra,char *buf)

{
  byte *pbVar1;
  uint uVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  void *__src;
  long lVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  uint8_t uVar11;
  run_container_t *run;
  uint16_t *__dest;
  int iVar12;
  long lVar13;
  uint16_t *puVar14;
  bool bVar15;
  bool bVar16;
  
  uVar6 = (ulong)ra->size;
  bVar15 = 0 < (long)uVar6;
  if (0 < (long)uVar6) {
    bVar15 = true;
    uVar8 = 1;
    do {
      uVar11 = ra->typecodes[uVar8 - 1];
      if (uVar11 == '\x04') {
        uVar11 = *(uint8_t *)((long)ra->containers[uVar8 - 1] + 8);
      }
      if (uVar11 == '\x03') break;
      bVar15 = uVar8 < uVar6;
      bVar16 = uVar8 != uVar6;
      uVar8 = uVar8 + 1;
    } while (bVar16);
  }
  if (bVar15) {
    *(int32_t *)buf = ra->size * 0x10000 + -0xcfc5;
    uVar2 = ra->size;
    iVar12 = uVar2 + 0xe;
    if (-1 < (int)(uVar2 + 7)) {
      iVar12 = uVar2 + 7;
    }
    uVar6 = (ulong)(uint)(iVar12 >> 3);
    __src = calloc(uVar6,1);
    if (__src == (void *)0x0) {
      __assert_fail("bitmapOfRunContainers != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x486f,"size_t ra_portable_serialize(const roaring_array_t *, char *)");
    }
    if (0 < (int)uVar2) {
      puVar3 = ra->typecodes;
      uVar8 = 0;
      do {
        uVar11 = puVar3[uVar8];
        if (uVar11 == '\x04') {
          uVar11 = *(uint8_t *)((long)ra->containers[uVar8] + 8);
        }
        if (uVar11 == '\x03') {
          pbVar1 = (byte *)((long)__src + (uVar8 >> 3 & 0x1fffffff));
          *pbVar1 = *pbVar1 | '\x01' << ((byte)uVar8 & 7);
        }
        uVar8 = uVar8 + 1;
      } while (uVar2 != uVar8);
    }
    memcpy(buf + 4,__src,uVar6);
    __dest = (uint16_t *)(buf + 4 + uVar6);
    free(__src);
    iVar5 = ra->size;
    iVar4 = iVar5 * 8;
    if (iVar5 < 4) {
      iVar4 = iVar5 * 4;
    }
    iVar12 = iVar4 + 4 + (iVar12 >> 3);
  }
  else {
    buf[0] = ':';
    buf[1] = '0';
    buf[2] = '\0';
    buf[3] = '\0';
    *(int32_t *)(buf + 4) = ra->size;
    __dest = (uint16_t *)(buf + 8);
    iVar12 = ra->size * 8 + 8;
  }
  if (ra->size < 1) {
    bVar16 = true;
  }
  else {
    lVar13 = 0;
    do {
      *__dest = ra->keys[lVar13];
      run = (run_container_t *)ra->containers[lVar13];
      uVar11 = ra->typecodes[lVar13];
      if (uVar11 == '\x04') {
        uVar11 = *(uint8_t *)&run->runs;
        if (uVar11 == '\x04') goto LAB_0011a591;
        run = *(run_container_t **)run;
      }
      if (uVar11 == '\x03') {
        lVar7 = cpuid_Extended_Feature_Enumeration_info(7);
        if ((*(uint *)(lVar7 + 4) & 0x20) == 0) {
          iVar5 = run->n_runs;
          lVar7 = (long)iVar5;
          if (0 < lVar7) {
            lVar10 = 0;
            do {
              iVar5 = iVar5 + (uint)run->runs[lVar10].length;
              lVar10 = lVar10 + 1;
            } while (lVar7 != lVar10);
          }
        }
        else {
          iVar5 = _avx2_run_container_cardinality(run);
        }
      }
      else {
        if ((uVar11 != '\x02') && (uVar11 != '\x01')) {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x10fa,"int container_get_cardinality(const container_t *, uint8_t)");
        }
        iVar5 = run->n_runs;
      }
      __dest[1] = (short)iVar5 - 1;
      __dest = __dest + 2;
      lVar13 = lVar13 + 1;
    } while (lVar13 < ra->size);
    bVar16 = ra->size < 4;
  }
  if ((!(bool)(bVar15 & bVar16)) && (0 < ra->size)) {
    lVar13 = 0;
    lVar7 = 0;
    do {
      *(int *)(__dest + lVar7 * 2) = iVar12;
      piVar9 = (int *)ra->containers[lVar7];
      uVar11 = ra->typecodes[lVar7];
      if (uVar11 == '\x04') {
        uVar11 = (uint8_t)piVar9[2];
        if (uVar11 == '\x04') goto LAB_0011a591;
        piVar9 = *(int **)piVar9;
      }
      if (uVar11 == '\x01') {
        iVar5 = 0x2000;
      }
      else if (uVar11 == '\x03') {
        iVar5 = *piVar9 * 4 + 2;
      }
      else {
        if (uVar11 != '\x02') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x11a5,"int32_t container_size_in_bytes(const container_t *, uint8_t)");
        }
        iVar5 = *piVar9 * 2;
      }
      iVar12 = iVar12 + iVar5;
      lVar7 = lVar7 + 1;
      lVar13 = lVar13 + 4;
    } while (lVar7 < ra->size);
    __dest = (uint16_t *)((long)__dest + lVar13);
  }
  if (0 < ra->size) {
    lVar13 = 0;
    do {
      puVar14 = (uint16_t *)ra->containers[lVar13];
      uVar11 = ra->typecodes[lVar13];
      if (uVar11 == '\x04') {
        uVar11 = (uint8_t)puVar14[4];
        if (uVar11 == '\x04') {
LAB_0011a591:
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        puVar14 = *(uint16_t **)puVar14;
      }
      if (uVar11 == '\x03') {
        *__dest = *puVar14;
        memcpy(__dest + 1,*(void **)(puVar14 + 4),(long)*(int *)puVar14 << 2);
        iVar12 = *(int *)puVar14 * 4 + 2;
      }
      else if (uVar11 == '\x02') {
        memcpy(__dest,*(void **)(puVar14 + 4),(long)*(int *)puVar14 * 2);
        iVar12 = *(int *)puVar14 * 2;
      }
      else {
        if (uVar11 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x118f,"int32_t container_write(const container_t *, uint8_t, char *)");
        }
        memcpy(__dest,*(void **)(puVar14 + 4),0x2000);
        iVar12 = 0x2000;
      }
      __dest = (uint16_t *)((long)__dest + (long)iVar12);
      lVar13 = lVar13 + 1;
    } while (lVar13 < ra->size);
  }
  return (long)__dest - (long)buf;
}

Assistant:

size_t ra_portable_serialize(const roaring_array_t *ra, char *buf) {
    char *initbuf = buf;
    uint32_t startOffset = 0;
    bool hasrun = ra_has_run_container(ra);
    if (hasrun) {
        uint32_t cookie = SERIAL_COOKIE | ((ra->size - 1) << 16);
        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        uint32_t s = (ra->size + 7) / 8;
        uint8_t *bitmapOfRunContainers = (uint8_t *)calloc(s, 1);
        assert(bitmapOfRunContainers != NULL);  // todo: handle
        for (int32_t i = 0; i < ra->size; ++i) {
            if (get_container_type(ra->containers[i], ra->typecodes[i]) ==
                RUN_CONTAINER_TYPE) {
                bitmapOfRunContainers[i / 8] |= (1 << (i % 8));
            }
        }
        memcpy(buf, bitmapOfRunContainers, s);
        buf += s;
        free(bitmapOfRunContainers);
        if (ra->size < NO_OFFSET_THRESHOLD) {
            startOffset = 4 + 4 * ra->size + s;
        } else {
            startOffset = 4 + 8 * ra->size + s;
        }
    } else {  // backwards compatibility
        uint32_t cookie = SERIAL_COOKIE_NO_RUNCONTAINER;

        memcpy(buf, &cookie, sizeof(cookie));
        buf += sizeof(cookie);
        memcpy(buf, &ra->size, sizeof(ra->size));
        buf += sizeof(ra->size);

        startOffset = 4 + 4 + 4 * ra->size + 4 * ra->size;
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        memcpy(buf, &ra->keys[k], sizeof(ra->keys[k]));
        buf += sizeof(ra->keys[k]);
        // get_cardinality returns a value in [1,1<<16], subtracting one
        // we get [0,1<<16 - 1] which fits in 16 bits
        uint16_t card = (uint16_t)(
            container_get_cardinality(ra->containers[k], ra->typecodes[k]) - 1);
        memcpy(buf, &card, sizeof(card));
        buf += sizeof(card);
    }
    if ((!hasrun) || (ra->size >= NO_OFFSET_THRESHOLD)) {
        // writing the containers offsets
        for (int32_t k = 0; k < ra->size; k++) {
            memcpy(buf, &startOffset, sizeof(startOffset));
            buf += sizeof(startOffset);
            startOffset =
                startOffset +
                container_size_in_bytes(ra->containers[k], ra->typecodes[k]);
        }
    }
    for (int32_t k = 0; k < ra->size; ++k) {
        buf += container_write(ra->containers[k], ra->typecodes[k], buf);
    }
    return buf - initbuf;
}